

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteCSource(CWriter *this)

{
  _Rb_tree_header *p_Var1;
  ExprList *exprs;
  pointer *ppLVar2;
  _Rb_tree_color _Var3;
  ExternalKind EVar4;
  pointer ppTVar5;
  FuncType *func_type;
  pointer ppTVar6;
  Tag *pTVar7;
  Type type;
  Module *pMVar8;
  pointer ppFVar9;
  pointer ppGVar10;
  DataSegment *pDVar11;
  byte *pbVar12;
  byte *pbVar13;
  pointer ppDVar14;
  pointer puVar15;
  pointer puVar16;
  char (*args) [10];
  long *plVar17;
  pointer ppEVar18;
  ElemSegment *pEVar19;
  pointer args_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>
  *__first;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>
  *__last;
  pointer pTVar20;
  pointer pTVar21;
  pointer ppVar22;
  pointer ppIVar23;
  Import *pIVar24;
  pointer ppVVar25;
  Var *var;
  pointer ppTVar26;
  pointer ppMVar27;
  _Hash_node_base *p_Var28;
  _Hash_node_base *p_Var29;
  _Hash_node_base *p_Var30;
  _Alloc_hider _Var31;
  size_type sVar32;
  byte bVar33;
  Index IVar34;
  size_t sVar35;
  iterator iVar36;
  pointer ppMVar37;
  Func *pFVar38;
  const_iterator cVar39;
  pointer ppTVar40;
  Table *dst_table;
  const_iterator cVar41;
  _Base_ptr p_Var42;
  OpenBrace *args_01;
  Newline *pNVar43;
  Newline *pNVar44;
  char *args_02;
  Newline *in_RDX;
  TypeVector *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  TypeVector *extraout_RDX_02;
  TypeVector *extraout_RDX_03;
  TypeVector *extraout_RDX_04;
  TypeVector *extraout_RDX_05;
  TypeVector *pTVar45;
  Newline *u;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *u_00;
  char (*extraout_RDX_08) [2];
  char (*extraout_RDX_09) [2];
  char (*extraout_RDX_10) [2];
  char (*extraout_RDX_11) [2];
  char (*u_01) [2];
  Newline *u_02;
  Newline *extraout_RDX_12;
  Newline *extraout_RDX_13;
  Newline *extraout_RDX_14;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  Newline *extraout_RDX_18;
  Newline *extraout_RDX_19;
  Newline *extraout_RDX_20;
  Newline *extraout_RDX_21;
  Newline *extraout_RDX_22;
  Newline *extraout_RDX_23;
  Newline *u_03;
  Newline *extraout_RDX_24;
  Newline *extraout_RDX_25;
  Newline *extraout_RDX_26;
  Newline *extraout_RDX_27;
  _Base_ptr u_04;
  Newline *u_05;
  Newline *u_06;
  Newline *u_07;
  Newline *extraout_RDX_28;
  Newline *extraout_RDX_29;
  char (*u_08) [2];
  Newline *extraout_RDX_30;
  Newline *u_09;
  Newline *extraout_RDX_31;
  Newline *u_10;
  Newline *u_11;
  Newline *extraout_RDX_32;
  Newline *extraout_RDX_33;
  Newline *extraout_RDX_34;
  Newline *u_12;
  Newline *extraout_RDX_35;
  Newline *extraout_RDX_36;
  Newline *extraout_RDX_37;
  Newline *extraout_RDX_38;
  Newline *extraout_RDX_39;
  Newline *extraout_RDX_40;
  Newline *extraout_RDX_41;
  Newline *extraout_RDX_42;
  Newline *extraout_RDX_43;
  Newline *extraout_RDX_44;
  Newline *extraout_RDX_45;
  size_t size;
  Newline *extraout_RDX_46;
  Newline *extraout_RDX_47;
  Newline *extraout_RDX_48;
  Newline *extraout_RDX_49;
  Newline *u_13;
  Newline *extraout_RDX_50;
  Newline *u_14;
  Newline *extraout_RDX_51;
  Newline *u_15;
  TypeEnum *extraout_RDX_52;
  TypeEnum *extraout_RDX_53;
  TypeEnum *u_16;
  TypeEnum *extraout_RDX_54;
  Newline *u_17;
  Newline *u_18;
  Newline *u_19;
  Newline *u_20;
  Newline *u_21;
  Newline *extraout_RDX_55;
  Newline *extraout_RDX_56;
  int iVar46;
  _Base_ptr p_Var47;
  pointer ppTVar48;
  pointer ppFVar49;
  pointer ppGVar50;
  pointer ppDVar51;
  long *plVar52;
  pointer ppEVar53;
  pointer ppIVar54;
  pointer ppVVar55;
  pointer ppTVar56;
  char (*in_RSI) [40];
  _Hash_node_base *p_Var57;
  FuncDeclaration *decl;
  char **expr_list;
  char *pcVar58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar59;
  SymbolMap *pSVar60;
  string *t_00;
  CloseBrace *t_01;
  GlobalName *in_R8;
  OpenBrace *in_R9;
  long lVar61;
  ulong uVar62;
  byte *pbVar63;
  uint uVar64;
  uint uVar65;
  Type *t;
  FuncSignature *this_00;
  SymbolSet *this_01;
  _Hash_node_base *p_Var66;
  type *condition;
  ulong uVar67;
  pointer __k;
  bool bVar68;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view export_name;
  string_view export_name_00;
  undefined1 auVar69 [16];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  type_hash;
  string serialized_type;
  string name;
  undefined1 local_148 [32];
  float local_128;
  size_t local_120;
  _Hash_node_base _Stack_118;
  _Base_ptr local_110;
  string local_108;
  anon_union_16_2_ecfd7102_for_Location_1 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Func *local_c0;
  Newline *local_b8;
  Newline *local_b0;
  Type local_a8;
  SymbolMap *local_a0;
  uint local_94;
  TypeVector *local_90;
  _Base_ptr local_88;
  SymbolSet *local_80;
  char *local_78;
  vector<wabt::Type,std::allocator<wabt::Type>> *local_70;
  StackVarSymbolMap *local_68;
  _Base_ptr local_60;
  SymbolMap *local_58;
  SymbolSet *local_50;
  SymbolSet *local_48;
  char (*local_40) [3];
  FuncSignature *local_38;
  
  this->stream_ = this->c_stream_;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,in_RSI,in_RDX);
  pcVar58 = s_source_includes;
  sVar35 = strlen(s_source_includes);
  WriteData(this,pcVar58,sVar35);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"#include \"",10);
  WriteData(this,(this->header_name_)._M_dataplus._M_p,(this->header_name_)._M_string_length);
  WriteData(this,"\"",1);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  pcVar58 = s_source_declarations;
  sVar35 = strlen(s_source_declarations);
  WriteData(this,pcVar58,sVar35);
  pTVar45 = extraout_RDX;
  if ((this->module_->types).
      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->module_->types).
      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    local_148._0_8_ = &_Stack_118;
    local_148._8_8_ = (Func *)0x1;
    local_148._16_8_ = (_Hash_node_base *)0x0;
    local_148._24_8_ = 0;
    local_128 = 1.0;
    local_120 = 0;
    _Stack_118._M_nxt = (_Hash_node_base *)0x0;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity =
         local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ppTVar56 = (this->module_->types).
               super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar5 = (this->module_->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar56 != ppTVar5) {
      p_Var47 = (_Base_ptr)&this->unique_func_type_names_;
      local_110 = p_Var47;
      do {
        func_type = (FuncType *)*ppTVar56;
        in_R8 = (GlobalName *)(func_type->super_TypeEntry).name._M_dataplus._M_p;
        name_00._M_str = (char *)in_R8;
        name_00._M_len = (func_type->super_TypeEntry).name._M_string_length;
        (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                  ((string *)&local_e0.field_0,(CWriter *)this,Type,name_00);
        if ((func_type->super_TypeEntry).kind_ != Func) goto LAB_0013f921;
        SerializeFuncType(func_type,&local_108);
        iVar36 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_148,&local_108);
        if (iVar36.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)p_Var47,(value_type *)&local_e0.field_0);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,std::__cxx11::string_const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_148,&local_108,&local_e0);
          WriteData(this,"FUNC_TYPE_T(",0xc);
          WriteData(this,(char *)CONCAT44(local_e0.field_0.first_column,local_e0.field_0.line),
                    CONCAT44(local_e0._12_4_,local_e0.field_0.last_column));
          WriteData(this,") = \"",5);
          sVar32 = local_108._M_string_length;
          _Var31._M_p = local_108._M_dataplus._M_p;
          pNVar43 = extraout_RDX_00;
          if ((Func *)local_108._M_string_length != (Func *)0x0) {
            pFVar38 = (Func *)0x0;
            do {
              Writef(this,"\\x%02x",(ulong)(byte)_Var31._M_p[(long)pFVar38]);
              pFVar38 = (Func *)((long)&(pFVar38->name)._M_dataplus._M_p + 1);
              pNVar43 = extraout_RDX_01;
            } while ((Func *)sVar32 != pFVar38);
          }
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])"\";",pNVar43);
          p_Var47 = local_110;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)p_Var47,
                      (value_type *)
                      ((long)iVar36.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_e0.field_0.first_column,local_e0.field_0.line) != &local_d0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_e0.field_0.first_column,local_e0.field_0.line),
                          local_d0._M_allocated_capacity + 1);
        }
        ppTVar56 = ppTVar56 + 1;
      } while (ppTVar56 != ppTVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_148);
    pTVar45 = extraout_RDX_02;
  }
  ppTVar6 = (this->module_->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar48 = (this->module_->tags).
                  super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar48 != ppTVar6; ppTVar48 = ppTVar48 + 1) {
    pTVar7 = *ppTVar48;
    uVar64 = (uint)((ulong)((long)(pTVar7->decl).sig.param_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar7->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3);
    if (1 < uVar64) {
      this_00 = &(pTVar7->decl).sig;
      (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
                ((string *)local_148,(CWriter *)this_00,pTVar45);
      WriteData(this,"#ifndef ",8);
      WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"#define ",8);
      WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
      WriteData(this," ",1);
      WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"struct ",7);
      WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
      WriteData(this," ",1);
      Write(this);
      uVar62 = 0;
      do {
        type = *(Type *)((long)(this_00->param_types).
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar62 * 8);
        Write(this,type);
        bVar33 = MangleType(type);
        Writef(this," %c%d;",(ulong)bVar33,uVar62 & 0xffffffff);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        uVar62 = uVar62 + 1;
      } while (uVar64 + (uVar64 == 0) != uVar62);
      Write(this);
      WriteData(this,";",1);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"#endif  /* ",0xb);
      WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
      WriteData(this," */",3);
      pTVar45 = extraout_RDX_03;
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        pTVar45 = extraout_RDX_04;
      }
      this->should_write_indent_next_ = true;
      if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        pTVar45 = extraout_RDX_05;
      }
    }
  }
  ppTVar48 = (this->module_->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar6 = (this->module_->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar48 != ppTVar6) {
    uVar64 = 0;
    do {
      uVar65 = this->module_->num_tag_imports;
      if (uVar65 <= uVar64) {
        pTVar7 = *ppTVar48;
        if (uVar64 == uVar65) {
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          WriteData(this,"typedef char wasm_tag_placeholder_t;",0x24);
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
        }
        in_R8 = (GlobalName *)(pTVar7->name)._M_dataplus._M_p;
        name_01._M_str = (char *)in_R8;
        name_01._M_len = (pTVar7->name)._M_string_length;
        (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                  ((string *)local_148,(CWriter *)this,Tag,name_01);
        WriteData(this,"static const wasm_tag_placeholder_t ",0x24);
        p_Var57 = (_Hash_node_base *)local_148._0_8_;
        WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])p_Var57,u);
        if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
      }
      uVar64 = uVar64 + 1;
      ppTVar48 = ppTVar48 + 1;
    } while (ppTVar48 != ppTVar6);
  }
  pMVar8 = this->module_;
  if ((long)(pMVar8->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pMVar8->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != (ulong)pMVar8->num_func_imports) {
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    ppFVar49 = (this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppFVar9 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar49 != ppFVar9) {
      uVar64 = 0;
      do {
        if (this->module_->num_func_imports <= uVar64) {
          pFVar38 = *ppFVar49;
          WriteData(this,"static ",7);
          decl = &pFVar38->decl;
          in_R8 = (GlobalName *)(pFVar38->name)._M_dataplus._M_p;
          name_02._M_str = (char *)in_R8;
          name_02._M_len = (pFVar38->name)._M_string_length;
          (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                    ((string *)local_148,(CWriter *)this,Func,name_02);
          WriteFuncDeclaration(this,decl,(string *)local_148);
          pNVar43 = extraout_RDX_06;
          if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
            decl = (FuncDeclaration *)(local_148._16_8_ + 1);
            operator_delete((void *)local_148._0_8_,(ulong)decl);
            pNVar43 = extraout_RDX_07;
          }
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&decl->has_func_type,pNVar43);
        }
        uVar64 = uVar64 + 1;
        ppFVar49 = ppFVar49 + 1;
      } while (ppFVar49 != ppFVar9);
    }
  }
  args_01 = (OpenBrace *)
            (this->module_->globals).
            super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (args_01 !=
      (OpenBrace *)
      (this->module_->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_globals(",0x19);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
               (char (*) [13])"* instance) ",args_01);
    if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
    }
    ppGVar50 = (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppGVar10 = (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppGVar50 != ppGVar10) {
      uVar64 = 0;
      do {
        if (this->module_->num_global_imports <= uVar64) {
          pFVar38 = (Func *)*ppGVar50;
          if (*(long *)((long)&(pFVar38->decl).type_var.loc.field_1 + 8) == 0) {
            __assert_fail("!global->init_expr.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                          ,0x69e,
                          "void wabt::(anonymous namespace)::CWriter::WriteGlobalInitializers()");
          }
          local_148._0_4_ = 1;
          expr_list = &(pFVar38->decl).type_var.loc.filename._M_str;
          local_148._8_8_ = pFVar38;
          Write(this,(ExternalInstanceRef *)local_148);
          WriteData(this," = ",3);
          WriteInitExpr(this,(ExprList *)expr_list);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])expr_list,u_00);
        }
        uVar64 = uVar64 + 1;
        ppGVar50 = ppGVar50 + 1;
      } while (ppGVar50 != ppGVar10);
    }
    Write(this);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
  }
  pMVar8 = this->module_;
  pNVar43 = (Newline *)
            (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pNVar43 !=
      (Newline *)
      (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    ppDVar51 = (pMVar8->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    p_Var47 = (_Base_ptr)
              (pMVar8->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_110 = p_Var47;
    if ((_Base_ptr)ppDVar51 != p_Var47) {
      do {
        pDVar11 = *ppDVar51;
        if ((pDVar11->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pDVar11->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_148._8_8_ = &pDVar11->name;
          local_148._0_4_ = 8;
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          WriteData(this,"static const u8 data_segment_data_",0x22);
          Write(this,(GlobalName *)local_148);
          pcVar58 = "[] = ";
          WriteData(this,"[] = ",5);
          Write(this);
          pbVar12 = (pDVar11->data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pbVar13 = (pDVar11->data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          u_01 = extraout_RDX_08;
          if (pbVar12 != pbVar13) {
            lVar61 = -1;
            uVar62 = 1;
            pbVar63 = pbVar12;
            do {
              pNVar43 = (Newline *)0xaaaaaaaaaaaaaaab;
              pcVar58 = "0x%02x, ";
              Writef(this,"0x%02x, ",(ulong)*pbVar63);
              u_01 = extraout_RDX_09;
              if ((uVar62 / 0xc) * 0xc + lVar61 == 0) {
                if (this->consecutive_newline_count_ < 2) {
                  pcVar58 = "\n";
                  WriteData(this,"\n",1);
                  this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                  u_01 = extraout_RDX_10;
                }
                this->should_write_indent_next_ = true;
              }
              p_Var47 = local_110;
              pbVar63 = pbVar63 + 1;
              lVar61 = lVar61 + -1;
              uVar62 = uVar62 + 1;
            } while (pbVar63 != pbVar13);
            if (pbVar12 != pbVar13) {
              if (this->consecutive_newline_count_ < 2) {
                pcVar58 = "\n";
                WriteData(this,"\n",1);
                this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                u_01 = extraout_RDX_11;
              }
              this->should_write_indent_next_ = true;
            }
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(CloseBrace *)pcVar58,u_01,pNVar43);
        }
        ppDVar51 = ppDVar51 + 1;
      } while ((_Base_ptr)ppDVar51 != p_Var47);
    }
    local_110 = (_Base_ptr)&this->module_prefix_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "w2c_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_110);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_memories(",0x1a);
    pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,pbVar59,(char (*) [13])"* instance) ",(OpenBrace *)pNVar43);
    if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
      pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_148._16_8_ + 1);
      operator_delete((void *)local_148._0_8_,(ulong)pbVar59);
    }
    pMVar8 = this->module_;
    ppMVar37 = (pMVar8->memories).
               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pNVar43 = (Newline *)
              ((long)(pMVar8->memories).
                     super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppMVar37 >> 3);
    uVar64 = pMVar8->num_memory_imports;
    pNVar44 = (Newline *)(ulong)uVar64;
    if (pNVar44 < pNVar43) {
      do {
        uVar64 = uVar64 + 1;
        pFVar38 = (Func *)ppMVar37[(long)pNVar44];
        uVar65 = 0x10000;
        if (*(bool *)&(pFVar38->decl).type_var.loc.filename._M_str == true) {
          uVar65 = (uint)(pFVar38->decl).type_var.loc.filename._M_len;
        }
        local_148._0_4_ = 7;
        local_148._8_8_ = pFVar38;
        WriteData(this,"wasm_rt_allocate_memory(",0x18);
        Write(this,(ExternalInstancePtr *)local_148);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(uint *)&pFVar38->decl);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)uVar65);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(bool *)((long)&(pFVar38->decl).type_var.loc.filename._M_str + 2));
        pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x168ac5;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x168ac5,u_02);
        pNVar44 = (Newline *)(ulong)uVar64;
        ppMVar37 = (this->module_->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pNVar43 = (Newline *)
                  ((long)(this->module_->memories).
                         super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)ppMVar37 >> 3);
      } while (pNVar44 < pNVar43);
    }
    ppDVar14 = (this->module_->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppDVar51 = (this->module_->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppDVar51 != ppDVar14;
        ppDVar51 = ppDVar51 + 1) {
      pDVar11 = *ppDVar51;
      if (pDVar11->kind == Active) {
        pMVar8 = this->module_;
        IVar34 = Module::GetMemoryIndex(pMVar8,&pDVar11->memory_var);
        local_148._8_8_ =
             (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start[IVar34];
        local_148._0_4_ = 7;
        WriteData(this,"LOAD_DATA(",10);
        Write(this,(ExternalInstanceRef *)local_148);
        WriteData(this,", ",2);
        WriteInitExpr(this,&pDVar11->offset);
        puVar15 = (pDVar11->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar16 = (pDVar11->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (puVar15 == puVar16) {
          WriteData(this,", NULL, 0",9);
          pNVar43 = extraout_RDX_13;
        }
        else {
          local_148._8_8_ = &pDVar11->name;
          local_148._0_4_ = 8;
          WriteData(this,", data_segment_data_",0x14);
          Write(this,(GlobalName *)local_148);
          WriteData(this,", ",2);
          Writef(this,"%u",(ulong)(uint)((int)puVar16 - (int)puVar15));
          pNVar43 = extraout_RDX_12;
        }
        pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x168ac5;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x168ac5,pNVar43);
        pNVar43 = extraout_RDX_14;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(CloseBrace *)pbVar59,pNVar43);
    pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (this->module_->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar59 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (this->module_->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "w2c_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110);
      pcVar58 = "static void init_data_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_data_instances(",
                 (char (*) [33])local_148,pbVar59,(char (*) [13])in_R8,in_R9);
      pNVar43 = extraout_RDX_15;
      if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
        pcVar58 = (char *)(local_148._16_8_ + 1);
        operator_delete((void *)local_148._0_8_,(ulong)pcVar58);
        pNVar43 = extraout_RDX_16;
      }
      ppDVar51 = (this->module_->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppDVar14 = (this->module_->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppDVar51 != ppDVar14) {
        do {
          pDVar11 = *ppDVar51;
          if ((pDVar11->kind == Passive) &&
             (args = (char (*) [10])
                     (pDVar11->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
             args != (char (*) [10])
                     (pDVar11->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
            local_148._8_8_ = &pDVar11->name;
            local_148._0_4_ = 8;
            pcVar58 = "instance->data_segment_dropped_";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [32])"instance->data_segment_dropped_",
                       (GlobalName *)local_148,args,(Newline *)in_R8);
            pNVar43 = extraout_RDX_17;
          }
          ppDVar51 = ppDVar51 + 1;
        } while (ppDVar51 != ppDVar14);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar58,pNVar43);
    }
  }
  pMVar8 = this->module_;
  if ((pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar43 = (Newline *)
              (pMVar8->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar44 = (Newline *)
              (pMVar8->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pNVar43 != pNVar44) {
      local_a0 = &this->import_module_sym_map_;
      local_110 = &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8 = (Type)&this->module_prefix_;
      local_b8 = pNVar44;
      do {
        lVar61 = *(long *)pNVar43;
        if ((*(long *)(lVar61 + 0x90) != *(long *)(lVar61 + 0x98)) &&
           (*(int *)(lVar61 + 0x70) != -0x11)) {
          local_148._8_8_ = lVar61 + 8;
          local_148._0_4_ = 6;
          local_b0 = pNVar43;
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          WriteData(this,"static const wasm_elem_segment_expr_t elem_segment_exprs_",0x39);
          Write(this,(GlobalName *)local_148);
          pcVar58 = "[] = ";
          WriteData(this,"[] = ",5);
          Write(this);
          plVar17 = *(long **)(lVar61 + 0x98);
          pNVar43 = extraout_RDX_18;
          for (plVar52 = *(long **)(lVar61 + 0x90); plVar52 != plVar17; plVar52 = plVar52 + 3) {
            if (plVar52[2] != 1) {
              __assert_fail("elem_expr.size() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                            ,0x727,
                            "void wabt::(anonymous namespace)::CWriter::WriteElemInitializers()");
            }
            iVar46 = *(int *)(*plVar52 + 0x38);
            if (iVar46 == 0x25) {
              pcVar58 = "{NULL, NULL, 0},";
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [17])"{NULL, NULL, 0},",pNVar43);
              pNVar43 = extraout_RDX_21;
            }
            else {
              if (iVar46 != 0x24) goto LAB_0013f91c;
              pFVar38 = Module::GetFunc(this->module_,(Var *)(*plVar52 + 0x40));
              local_108._M_dataplus._M_p =
                   (pointer)Module::GetFuncType(this->module_,&(pFVar38->decl).type_var);
              local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
              local_148._8_8_ = pFVar38;
              WriteData(this,"{",1);
              Write(this,(FuncTypeExpr *)&local_108);
              WriteData(this,", (wasm_rt_function_ptr_t)",0x1a);
              Write(this,(ExternalPtr *)local_148);
              WriteData(this,", ",2);
              pSVar60 = local_a0;
              cVar39 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find(&local_a0->_M_t,&pFVar38->name);
              if (cVar39._M_node == local_110) {
                WriteData(this,"0",1);
                pNVar43 = extraout_RDX_22;
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_148,"w2c_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8);
                local_108._M_string_length =
                     (size_type)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pSVar60,&pFVar38->name);
                local_108._M_dataplus._M_p._0_4_ = 2;
                WriteData(this,"offsetof(",9);
                WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
                (anonymous_namespace)::CWriter::
                Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2]>
                          ((CWriter *)this,(char (*) [3])0x168b07,(GlobalName *)&local_108,
                           (char (*) [2])pNVar44);
                pNVar43 = extraout_RDX_19;
                if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
                  operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
                  pNVar43 = extraout_RDX_20;
                }
              }
              pcVar58 = "},";
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [3])0x16667a,pNVar43);
              pNVar43 = extraout_RDX_23;
            }
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(CloseBrace *)pcVar58,(char (*) [2])pNVar43,pNVar44);
          pNVar44 = local_b8;
          pNVar43 = local_b0;
        }
        pNVar43 = pNVar43 + 8;
      } while (pNVar43 != pNVar44);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_tables(",0x18);
    pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,pbVar59,(char (*) [13])"* instance) ",(OpenBrace *)pNVar44);
    if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
      pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_148._16_8_ + 1);
      operator_delete((void *)local_148._0_8_,(ulong)pbVar59);
    }
    pMVar8 = this->module_;
    ppTVar40 = (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pNVar43 = (Newline *)
              ((long)(pMVar8->tables).
                     super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppTVar40 >> 3);
    uVar64 = pMVar8->num_table_imports;
    pNVar44 = (Newline *)(ulong)uVar64;
    if (pNVar44 < pNVar43) {
      do {
        uVar64 = uVar64 + 1;
        pFVar38 = (Func *)ppTVar40[(long)pNVar44];
        uVar65 = 0xffffffff;
        if (*(bool *)&(pFVar38->decl).type_var.loc.filename._M_str == true) {
          uVar65 = (uint)(pFVar38->decl).type_var.loc.filename._M_len;
        }
        iVar46 = (pFVar38->decl).type_var.loc.field_1.field_0.line;
        pcVar58 = "funcref";
        if (iVar46 != -0x10) {
          if (iVar46 != -0x11) goto LAB_0013f91c;
          pcVar58 = "externref";
        }
        local_148._0_4_ = 5;
        local_148._8_8_ = pFVar38;
        WriteData(this,"wasm_rt_allocate_",0x11);
        sVar35 = strlen(pcVar58);
        WriteData(this,pcVar58,sVar35);
        WriteData(this,"_table(",7);
        Write(this,(ExternalInstancePtr *)local_148);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(uint *)&pFVar38->decl);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)uVar65);
        pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x168ac5;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x168ac5,u_03);
        pNVar44 = (Newline *)(ulong)uVar64;
        ppTVar40 = (this->module_->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pNVar43 = (Newline *)
                  ((long)(this->module_->tables).
                         super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppTVar40 >> 3);
      } while (pNVar44 < pNVar43);
    }
    ppEVar18 = (this->module_->elem_segments).
               super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppEVar53 = (this->module_->elem_segments).
                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar53 != ppEVar18;
        ppEVar53 = ppEVar53 + 1) {
      pEVar19 = *ppEVar53;
      if (pEVar19->kind == Active) {
        dst_table = Module::GetTable(this->module_,&pEVar19->table_var);
        pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        WriteElemTableInit(this,true,pEVar19,dst_table);
        pNVar43 = extraout_RDX_24;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(CloseBrace *)pbVar59,pNVar43);
    pbVar59 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (this->module_->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar59 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (this->module_->elem_segments).
        super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "w2c_",&this->module_prefix_);
      pcVar58 = "static void init_elem_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_elem_instances(",
                 (char (*) [33])local_148,pbVar59,(char (*) [13])in_R8,in_R9);
      pNVar43 = extraout_RDX_25;
      if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
        pcVar58 = (char *)(local_148._16_8_ + 1);
        operator_delete((void *)local_148._0_8_,(ulong)pcVar58);
        pNVar43 = extraout_RDX_26;
      }
      ppEVar53 = (this->module_->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar18 = (this->module_->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar53 != ppEVar18) {
        do {
          pEVar19 = *ppEVar53;
          if ((pEVar19->kind == Passive) &&
             (args_00 = (pEVar19->elem_exprs).
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             args_00 !=
             (pEVar19->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_148._8_8_ = &pEVar19->name;
            local_148._0_4_ = 6;
            pcVar58 = "instance->elem_segment_dropped_";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [32])0x1667d4,(GlobalName *)local_148,
                       (char (*) [10])args_00,(Newline *)in_R8);
            pNVar43 = extraout_RDX_27;
          }
          ppEVar53 = ppEVar53 + 1;
        } while (ppEVar53 != ppEVar18);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar58,pNVar43);
    }
  }
  args_02 = (char *)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
  pcVar58 = (char *)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  if (args_02 != pcVar58) {
    local_48 = &this->global_syms_;
    local_50 = &this->local_syms_;
    local_58 = &this->local_sym_map_;
    local_60 = &(this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = &this->stack_var_sym_map_;
    p_Var1 = &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header;
    this_01 = &this->func_includes_;
    p_Var47 = &(this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = (vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_;
    uVar64 = 0;
    local_88 = p_Var47;
    local_80 = this_01;
    local_78 = pcVar58;
    do {
      if (this->module_->num_func_imports <= uVar64) {
        local_c0 = *(Func **)args_02;
        local_94 = uVar64;
        local_40 = (char (*) [3])args_02;
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        this->func_ = local_c0;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_50->_M_t,&local_48->_M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase(&local_58->_M_t,
                   (_Link_type)
                   (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_60;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_60;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::
        _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase(&local_68->_M_t,
                   (_Link_type)
                   (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __first = (this->func_sections_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __last = (this->func_sections_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__last != __first) {
          std::_Destroy_aux<false>::__destroy<std::pair<std::__cxx11::string,wabt::MemoryStream>*>
                    (__first,__last);
          (this->func_sections_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __first;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this_01->_M_t,
                   (_Link_type)
                   (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var47;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var47;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_38 = &(local_c0->decl).sig;
        local_108._M_dataplus._M_p = (pointer)&(local_c0->decl).sig.result_types;
        local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
        local_148._8_8_ = local_c0;
        local_90 = (TypeVector *)local_108._M_dataplus._M_p;
        WriteData(this,"static ",7);
        Write(this,(ResultType *)&local_108);
        WriteData(this," ",1);
        Write(this,(GlobalName *)local_148);
        WriteData(this,"(",1);
        local_108.field_2._M_allocated_capacity = 0;
        local_108._M_dataplus._M_p = (pointer)0x0;
        local_108._M_string_length = 0;
        pFVar38 = this->func_;
        pTVar20 = (pFVar38->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pTVar21 = (pFVar38->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        IVar34 = LocalTypes::size(&pFVar38->local_types);
        MakeTypeBindingReverseMapping
                  ((ulong)((int)((ulong)((long)pTVar20 - (long)pTVar21) >> 3) + IVar34),
                   &this->func_->bindings,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_108);
        WriteParams(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_108);
        WriteData(this," ",1);
        Write(this);
        local_b8 = (Newline *)
                   ((ulong)((long)(this->func_->decl).sig.param_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->func_->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3);
        pNVar43 = (Newline *)0x0;
        do {
          p_Var47 = (_Base_ptr)
                    (this->func_->local_types).decls_.
                    super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          u_04 = (_Base_ptr)
                 (this->func_->local_types).decls_.
                 super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if (p_Var47 != u_04) {
            pSVar60 = (SymbolMap *)(ulong)*(uint *)(pNVar43 + 0x1658d4);
            local_a8 = (Type)((ulong)pSVar60 | 0xffffffff00000000);
            uVar62 = 0;
            uVar67 = (ulong)local_b8 & 0xffffffff;
            uVar64 = 0;
            local_110 = u_04;
            local_b0 = pNVar43;
            local_a0 = pSVar60;
            do {
              _Var3 = p_Var47->_M_color;
              if ((_Rb_tree_color)pSVar60 == _Var3) {
                if (uVar62 == 0) {
                  Write(this,local_a8);
                  WriteData(this," ",1);
                  this->indent_ = this->indent_ + 4;
                }
                else {
                  WriteData(this,", ",2);
                  if ((uVar62 & 7) == 0) {
                    if (this->consecutive_newline_count_ < 2) {
                      WriteData(this,"\n",1);
                      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                    }
                    this->should_write_indent_next_ = true;
                  }
                }
                name_03._M_str = *(char **)(local_108._M_dataplus._M_p + uVar67 * 0x20);
                name_03._M_len = *(size_t *)(local_108._M_dataplus._M_p + uVar67 * 0x20 + 8);
                (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                          ((string *)local_148,(CWriter *)this,name_03,false);
                WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
                WriteData(this," = ",3);
                if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
                  operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
                }
                if (_Var3 == 0xfffffffb) {
                  sVar35 = 0x1b;
                  pcVar58 = "simde_wasm_i64x2_make(0, 0)";
                }
                else {
                  pcVar58 = "wasm_rt_funcref_null_value";
                  if (_Var3 != 0xfffffff0) {
                    if (_Var3 != 0xffffffef) {
                      sVar35 = 1;
                      pcVar58 = "0";
                      goto LAB_0013e75f;
                    }
                    pcVar58 = "wasm_rt_externref_null_value";
                  }
                  sVar35 = strlen(pcVar58);
                }
LAB_0013e75f:
                WriteData(this,pcVar58,sVar35);
                uVar62 = uVar62 + 1;
                u_04 = local_110;
                pSVar60 = local_a0;
              }
              pNVar43 = local_b0;
              uVar64 = uVar64 + 1;
              bVar68 = *(uint *)&p_Var47->_M_parent <= uVar64;
              if (bVar68) {
                p_Var47 = (_Base_ptr)((long)&p_Var47->_M_parent + 4);
              }
              if (bVar68) {
                uVar64 = 0;
              }
              uVar67 = (ulong)((int)uVar67 + 1);
            } while (uVar64 != 0 || p_Var47 != u_04);
            if (uVar62 != 0) {
              iVar46 = this->indent_;
              this->indent_ = iVar46 + -4;
              if (iVar46 < 4) goto LAB_0013f8de;
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [2])pSVar60,(Newline *)u_04);
            }
          }
          pNVar43 = pNVar43 + 4;
        } while (pNVar43 != (Newline *)0x1c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_108);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [15])"FUNC_PROLOGUE;",u_05);
        PushFuncSection(this,(string_view)(ZEXT816(0x1647ad) << 0x40));
        in_R8 = (GlobalName *)0x1;
        name_04._M_str = "$Bfunc";
        name_04._M_len = 6;
        (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                  ((string *)local_148,(CWriter *)this,name_04,true);
        ResetTypeStack(this,0);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_allocated_capacity =
             local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
        PushLabel(this,First,&local_108,local_38,SUB81(in_R8,0));
        exprs = &local_c0->exprs;
        local_e0.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)&local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_148._0_8_,
                   (pointer)(local_148._0_8_ + (long)(string *)local_148._8_8_));
        Write(this,exprs);
        Write(this,(LabelDecl *)&local_e0.field_0);
        if (local_e0.field_1.offset !=
            (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)&local_d0) {
          operator_delete((void *)local_e0.field_1.offset,local_d0._M_allocated_capacity + 1);
        }
        ppLVar2 = &(this->label_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar2 = *ppLVar2 + -1;
        ResetTypeStack(this,0);
        pFVar38 = local_c0;
        std::vector<wabt::Type,std::allocator<wabt::Type>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
                  (local_70,(this->type_stack_).
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                   (local_c0->decl).sig.result_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start);
        pcVar58 = "FUNC_EPILOGUE;";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [15])"FUNC_EPILOGUE;",u_06);
        pTVar45 = local_90;
        uVar62 = (ulong)((long)*(pointer *)
                                ((long)&(pFVar38->decl).sig.result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl + 8) -
                        (long)(pFVar38->decl).sig.result_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3;
        iVar46 = (int)uVar62;
        if (iVar46 != 0) {
          if (iVar46 == 1) {
            local_e0.field_0.line = 0;
            local_e0.field_0.first_column = 0;
            local_e0.field_0.last_column = -1;
            WriteData(this,"return ",7);
            pcVar58 = (char *)&local_e0;
            Write(this,(StackVar *)pcVar58);
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [2])pcVar58,u_07);
          }
          else {
            Write(this);
            local_e0.field_0.line = (int)pTVar45;
            local_e0.field_0.first_column = (int)((ulong)pTVar45 >> 0x20);
            Write(this,(ResultType *)&local_e0.field_0);
            WriteData(this," tmp;",5);
            pNVar43 = extraout_RDX_28;
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
              pNVar43 = extraout_RDX_29;
            }
            pTVar45 = local_90;
            this->should_write_indent_next_ = true;
            if (iVar46 != 0) {
              uVar67 = 0;
              do {
                iVar46 = iVar46 + -1;
                bVar33 = MangleType((pTVar45->
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar67]);
                pNVar43 = (Newline *)(uVar67 & 0xffffffff);
                Writef(this,"tmp.%c%d = ",(ulong)bVar33);
                local_e0.field_0.first_column = 0;
                local_e0.field_0.last_column = -1;
                local_e0.field_0.line = iVar46;
                (anonymous_namespace)::CWriter::
                Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                          ((CWriter *)this,(StackVar *)&local_e0.field_0,u_08,pNVar43);
                uVar67 = uVar67 + 1;
                pNVar43 = extraout_RDX_30;
              } while ((uVar62 & 0xffffffff) != uVar67);
            }
            pcVar58 = "return tmp;";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [12])"return tmp;",pNVar43);
            (anonymous_namespace)::CWriter::
            Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(CloseBrace *)pcVar58,u_09);
          }
        }
        this->stream_ = this->c_stream_;
        lVar61 = 0;
        do {
          p_Var42 = (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)p_Var42 != p_Var1) {
            uVar64 = *(uint *)((long)&DAT_001658d4 + lVar61);
            uVar62 = 0;
            do {
              if (uVar64 == *(uint *)&p_Var42[1].field_0x4) {
                if (uVar62 == 0) {
                  Write(this,(Type)((ulong)uVar64 | 0xffffffff00000000));
                  WriteData(this," ",1);
                  this->indent_ = this->indent_ + 4;
                }
                else {
                  WriteData(this,", ",2);
                  if ((uVar62 & 7) == 0) {
                    if (this->consecutive_newline_count_ < 2) {
                      WriteData(this,"\n",1);
                      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                    }
                    this->should_write_indent_next_ = true;
                  }
                }
                pcVar58 = (char *)p_Var42[1]._M_left;
                WriteData(this,pcVar58,(size_t)p_Var42[1]._M_right);
                uVar62 = uVar62 + 1;
              }
              auVar69 = std::_Rb_tree_increment(p_Var42);
              p_Var42 = auVar69._0_8_;
            } while ((_Rb_tree_header *)p_Var42 != p_Var1);
            if (uVar62 != 0) {
              iVar46 = this->indent_;
              this->indent_ = iVar46 + -4;
              if (iVar46 < 4) {
LAB_0013f8de:
                __assert_fail("indent_ >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                              ,0x373,"void wabt::(anonymous namespace)::CWriter::Dedent(int)");
              }
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [2])pcVar58,auVar69._8_8_);
            }
          }
          this_01 = local_80;
          p_Var47 = local_88;
          lVar61 = lVar61 + 4;
        } while (lVar61 != 0x1c);
        ppVar22 = (this->func_sections_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (__k = (this->func_sections_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != ppVar22; __k = __k + 1) {
          MemoryStream::ReleaseOutputBuffer(&__k->second);
          if ((__k->first)._M_string_length == 0) {
LAB_0013eb80:
            in_R8 = (GlobalName *)0x0;
            Stream::WriteData(this->stream_,*(void **)local_e0.field_1.offset,
                              (long)*(pointer *)((long)local_e0.field_1.offset + 8) -
                              (long)*(void **)local_e0.field_1.offset,(char *)0x0,No);
          }
          else {
            cVar41 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&this_01->_M_t,&__k->first);
            if (cVar41._M_node != p_Var47) goto LAB_0013eb80;
          }
          if (local_e0.field_1.offset != 0) {
            std::default_delete<wabt::OutputBuffer>::operator()
                      ((default_delete<wabt::OutputBuffer> *)&local_e0.field_0,
                       (OutputBuffer *)local_e0.field_1.offset);
          }
        }
        Write(this);
        this->func_ = (Func *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        args_02 = *local_40;
        pcVar58 = local_78;
        uVar64 = local_94;
      }
      uVar64 = uVar64 + 1;
      args_02 = *(char (*) [3])((long)args_02 + 6) + 2;
    } while (args_02 != pcVar58);
  }
  WriteExports(this,Definitions);
  if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_instance_import(",0x21);
    WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
    WriteData(this,"* instance",10);
    if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
    }
    p_Var42 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var42 != p_Var1) {
      do {
        module_name._M_str = args_02;
        module_name._M_len = *(size_t *)(p_Var42 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)local_148,(CWriter *)p_Var42[1]._M_parent,module_name);
        local_108._M_dataplus._M_p._0_4_ = 2;
        local_108._M_string_length = (size_type)(p_Var42 + 1);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                  ((CWriter *)this,(char (*) [10])local_148,&local_108,(char (*) [3])args_02,in_R8);
        if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
        p_Var42 = (_Base_ptr)std::_Rb_tree_increment(p_Var42);
      } while ((_Rb_tree_header *)p_Var42 != p_Var1);
    }
    t_00 = (string *)0x165cb3;
    WriteData(this,")",1);
    Write(this);
    p_Var42 = (this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header;
    pNVar43 = extraout_RDX_31;
    if ((_Rb_tree_header *)p_Var42 != p_Var1) {
      do {
        local_148._8_8_ = p_Var42 + 1;
        local_148._0_4_ = 2;
        local_108._M_dataplus._M_p._0_4_ = 2;
        local_108._M_string_length = local_148._8_8_;
        WriteData(this,"instance->",10);
        Write(this,(GlobalName *)local_148);
        WriteData(this," = ",3);
        t_00 = &local_108;
        Write(this,(GlobalName *)&local_108);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])t_00,u_10);
        auVar69 = std::_Rb_tree_increment(p_Var42);
        pNVar43 = auVar69._8_8_;
        p_Var42 = auVar69._0_8_;
      } while ((_Rb_tree_header *)p_Var42 != p_Var1);
    }
    ppIVar54 = (this->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar23 = (this->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar54 != ppIVar23) {
      do {
        pIVar24 = *ppIVar54;
        EVar4 = pIVar24->kind_;
        args_02 = (char *)(ulong)(EVar4 - Table);
        if (EVar4 - Table < 3) {
          module_name_00._M_str = (char *)(pIVar24->field_name)._M_string_length;
          module_name_00._M_len = (size_t)(pIVar24->module_name)._M_dataplus._M_p;
          export_name._M_str = (char *)in_R9;
          export_name._M_len = (size_t)(pIVar24->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)local_148,(CWriter *)(pIVar24->module_name)._M_string_length,
                     module_name_00,export_name);
          in_R8 = (GlobalName *)(pIVar24->field_name)._M_dataplus._M_p;
          args_02 = (char *)(pIVar24->field_name)._M_string_length;
          module_name_01._M_str = args_02;
          module_name_01._M_len = (size_t)(pIVar24->module_name)._M_dataplus._M_p;
          export_name_00._M_str = (char *)in_R9;
          export_name_00._M_len = (size_t)in_R8;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    (&local_108,(CWriter *)(pIVar24->module_name)._M_string_length,module_name_01,
                     export_name_00);
          local_e0.field_0.line = 2;
          local_e0._8_8_ = &pIVar24->module_name;
          WriteData(this,"instance->",10);
          WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
          WriteData(this," = ",3);
          WriteData(this,local_108._M_dataplus._M_p,local_108._M_string_length);
          WriteData(this,"(",1);
          Write(this,(GlobalName *)&local_e0.field_0);
          t_00 = (string *)0x168ac5;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x168ac5,u_11);
          pNVar43 = extraout_RDX_32;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            t_00 = (string *)(local_108.field_2._M_allocated_capacity + 1);
            operator_delete(local_108._M_dataplus._M_p,(ulong)t_00);
            pNVar43 = extraout_RDX_33;
          }
          if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
            t_00 = (string *)(local_148._16_8_ + 1);
            operator_delete((void *)local_148._0_8_,(ulong)t_00);
            pNVar43 = extraout_RDX_34;
          }
        }
        else if ((EVar4 != First) && (EVar4 != Last)) goto LAB_0013f91c;
        ppIVar54 = ppIVar54 + 1;
      } while (ppIVar54 != ppIVar23);
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(CloseBrace *)t_00,pNVar43);
  }
  WriteImportProperties(this,Definitions);
  local_110 = (_Base_ptr)&this->module_prefix_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "w2c_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"void ",5);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_instantiate(",0xd);
  WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
  WriteData(this,"* instance",10);
  if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
  }
  p_Var42 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var42 != p_Var1) {
    do {
      module_name_02._M_str = args_02;
      module_name_02._M_len = *(size_t *)(p_Var42 + 1);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)local_148,(CWriter *)p_Var42[1]._M_parent,module_name_02);
      local_108._M_dataplus._M_p._0_4_ = 2;
      local_108._M_string_length = (size_type)(p_Var42 + 1);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                ((CWriter *)this,(char (*) [10])local_148,&local_108,(char (*) [3])args_02,in_R8);
      if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
      }
      p_Var42 = (_Base_ptr)std::_Rb_tree_increment(p_Var42);
    } while ((_Rb_tree_header *)p_Var42 != p_Var1);
  }
  WriteData(this,") ",2);
  Write(this);
  pcVar58 = "assert(wasm_rt_is_initialized());";
  (anonymous_namespace)::CWriter::Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [34])"assert(wasm_rt_is_initialized());",u_12);
  pNVar43 = extraout_RDX_35;
  if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    WriteData(this,"init_instance_import(instance",0x1d);
    p_Var42 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pNVar43 = extraout_RDX_36;
    if ((_Rb_tree_header *)p_Var42 != p_Var1) {
      do {
        local_148._8_8_ = p_Var42 + 1;
        local_148._0_4_ = 2;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                  ((CWriter *)this,(char (*) [3])0x168b07,(GlobalName *)local_148);
        auVar69 = std::_Rb_tree_increment(p_Var42);
        pNVar43 = auVar69._8_8_;
        p_Var42 = auVar69._0_8_;
      } while ((_Rb_tree_header *)p_Var42 != p_Var1);
    }
    pcVar58 = ");";
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x168ac5,pNVar43);
    pNVar43 = extraout_RDX_37;
  }
  if ((this->module_->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->module_->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar58 = "init_globals(instance);";
    WriteData(this,"init_globals(instance);",0x17);
    pNVar43 = extraout_RDX_38;
    if (this->consecutive_newline_count_ < 2) {
      pcVar58 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar43 = extraout_RDX_39;
    }
    this->should_write_indent_next_ = true;
  }
  if ((this->module_->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->module_->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar58 = "init_memories(instance);";
    WriteData(this,"init_memories(instance);",0x18);
    pNVar43 = extraout_RDX_40;
    if (this->consecutive_newline_count_ < 2) {
      pcVar58 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar43 = extraout_RDX_41;
    }
    this->should_write_indent_next_ = true;
  }
  if ((this->module_->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->module_->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar58 = "init_tables(instance);";
    WriteData(this,"init_tables(instance);",0x16);
    pNVar43 = extraout_RDX_42;
    if (this->consecutive_newline_count_ < 2) {
      pcVar58 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar43 = extraout_RDX_43;
    }
    this->should_write_indent_next_ = true;
  }
  pMVar8 = this->module_;
  if (((pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((pMVar8->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar8->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pcVar58 = "init_data_instances(instance);";
    (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [31])"init_data_instances(instance);",pNVar43);
    pNVar43 = extraout_RDX_44;
  }
  pMVar8 = this->module_;
  if (((pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((pMVar8->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar8->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pcVar58 = "init_elem_instances(instance);";
    (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [31])"init_elem_instances(instance);",pNVar43);
    pNVar43 = extraout_RDX_45;
  }
  ppVVar55 = (this->module_->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar25 = (this->module_->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar55 != ppVVar25) {
    do {
      var = *ppVVar55;
      local_148._8_8_ = Module::GetFunc(this->module_,var);
      local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
      Write(this,(ExternalRef *)local_148);
      pFVar38 = Module::GetFunc(this->module_,var);
      cVar39 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&(this->import_module_sym_map_)._M_t,&pFVar38->name);
      if ((_Rb_tree_header *)cVar39._M_node ==
          &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header) {
        size = 0xb;
        pcVar58 = "(instance);";
      }
      else {
        pFVar38 = Module::GetFunc(this->module_,var);
        local_148._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->import_module_sym_map_,&pFVar38->name);
        local_148._0_4_ = 2;
        WriteData(this,"(instance->",0xb);
        Write(this,(GlobalName *)local_148);
        size = 2;
        pcVar58 = ");";
      }
      WriteData(this,pcVar58,size);
      pNVar43 = extraout_RDX_46;
      if (this->consecutive_newline_count_ < 2) {
        pcVar58 = "\n";
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        pNVar43 = extraout_RDX_47;
      }
      this->should_write_indent_next_ = true;
      ppVVar55 = ppVVar55 + 1;
    } while (ppVVar55 != ppVVar25);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar58,pNVar43);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "w2c_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"void ",5);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_free(",6);
  WriteData(this,(char *)local_148._0_8_,local_148._8_8_);
  pcVar58 = "* instance) ";
  WriteData(this,"* instance) ",0xc);
  Write(this);
  pNVar43 = extraout_RDX_48;
  if ((_Hash_node_base *)local_148._0_8_ != (_Hash_node_base *)(local_148 + 0x10)) {
    pcVar58 = (char *)(local_148._16_8_ + 1);
    operator_delete((void *)local_148._0_8_,(ulong)pcVar58);
    pNVar43 = extraout_RDX_49;
  }
  ppTVar40 = (this->module_->tables).
             super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar26 = (this->module_->tables).
             super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar40 != ppTVar26) {
    uVar64 = 0;
    do {
      if (this->module_->num_table_imports <= uVar64) {
        iVar46 = (((Func *)*ppTVar40)->decl).type_var.loc.field_1.field_0.line;
        pcVar58 = "funcref";
        if (iVar46 != -0x10) {
          if (iVar46 != -0x11) {
LAB_0013f91c:
            abort();
          }
          pcVar58 = "externref";
        }
        local_148._0_4_ = 5;
        local_148._8_8_ = (Func *)*ppTVar40;
        WriteData(this,"wasm_rt_free_",0xd);
        sVar35 = strlen(pcVar58);
        WriteData(this,pcVar58,sVar35);
        WriteData(this,"_table(",7);
        Write(this,(ExternalInstancePtr *)local_148);
        pcVar58 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x168ac5,u_13);
        pNVar43 = extraout_RDX_50;
      }
      uVar64 = uVar64 + 1;
      ppTVar40 = ppTVar40 + 1;
    } while (ppTVar40 != ppTVar26);
  }
  ppMVar37 = (this->module_->memories).
             super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppMVar27 = (this->module_->memories).
             super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppMVar37 != ppMVar27) {
    uVar64 = 0;
    do {
      if (this->module_->num_memory_imports <= uVar64) {
        local_148._8_8_ = *ppMVar37;
        local_148._0_4_ = 7;
        WriteData(this,"wasm_rt_free_memory(",0x14);
        Write(this,(ExternalInstancePtr *)local_148);
        pcVar58 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x168ac5,u_14);
        pNVar43 = extraout_RDX_51;
      }
      uVar64 = uVar64 + 1;
      ppMVar37 = ppMVar37 + 1;
    } while (ppMVar37 != ppMVar27);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar58,pNVar43);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"wasm_rt_func_type_t ",0x14);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_get_func_type(uint32_t param_count, uint32_t result_count, ...) ",0x41);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [14])"va_list args;",u_15);
  p_Var47 = (_Base_ptr)
            (this->module_->types).
            super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = (_Base_ptr)
              (this->module_->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (p_Var47 != local_110) {
    do {
      p_Var57 = *(_Hash_node_base **)p_Var47;
      if (*(int *)&p_Var57[9]._M_nxt != 0) {
LAB_0013f921:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x48,
                      "const Derived *wabt::cast(const Base *) [Derived = wabt::FuncType, Base = wabt::TypeEntry]"
                     );
      }
      p_Var66 = p_Var57[0xb]._M_nxt;
      p_Var28 = p_Var57[0xe]._M_nxt;
      p_Var29 = p_Var57[10]._M_nxt;
      p_Var30 = p_Var57[0xd]._M_nxt;
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"if (param_count == ",0x13);
      Writef(this,"%u",(ulong)((long)p_Var66 - (long)p_Var29) >> 3 & 0xffffffff);
      WriteData(this," && result_count == ",0x14);
      Writef(this,"%u",(ulong)((long)p_Var28 - (long)p_Var30) >> 3 & 0xffffffff);
      WriteData(this,") ",2);
      Write(this);
      WriteData(this,"va_start(args, result_count);",0x1d);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"if (true",8);
      p_Var28 = p_Var57[0xb]._M_nxt;
      u_16 = extraout_RDX_52;
      for (p_Var66 = p_Var57[10]._M_nxt; p_Var66 != p_Var28; p_Var66 = p_Var66 + 1) {
        local_148._0_8_ = p_Var66->_M_nxt;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                  ((CWriter *)this,(char (*) [37])local_148,u_16);
        u_16 = extraout_RDX_53;
      }
      p_Var28 = p_Var57[0xe]._M_nxt;
      for (p_Var66 = p_Var57[0xd]._M_nxt; p_Var66 != p_Var28; p_Var66 = p_Var66 + 1) {
        local_148._0_8_ = p_Var66->_M_nxt;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                  ((CWriter *)this,(char (*) [37])local_148,u_16);
        u_16 = extraout_RDX_54;
      }
      WriteData(this,") ",2);
      Write(this);
      (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"va_end(args);",u_17);
      local_148._0_8_ = p_Var57;
      WriteData(this,"return ",7);
      t_01 = (CloseBrace *)local_148;
      Write(this,(FuncTypeExpr *)local_148);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [2])t_01,u_18);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,t_01,u_19);
      pcVar58 = "va_end(args);";
      (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"va_end(args);",u_20);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar58,u_21);
      p_Var47 = (_Base_ptr)&p_Var47->_M_parent;
    } while (p_Var47 != local_110);
  }
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  pcVar58 = "return NULL;";
  WriteData(this,"return NULL;",0xc);
  pNVar43 = extraout_RDX_55;
  if (this->consecutive_newline_count_ < 2) {
    pcVar58 = "\n";
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    pNVar43 = extraout_RDX_56;
  }
  this->should_write_indent_next_ = true;
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar58,pNVar43);
  return;
}

Assistant:

void CWriter::WriteCSource() {
  stream_ = c_stream_;
  Write("/* Automatically generated by wasm2c */", Newline());
  WriteSourceTop();
  WriteFuncTypes();
  WriteTagTypes();
  WriteTags();
  WriteFuncDeclarations();
  WriteGlobalInitializers();
  WriteDataInitializers();
  WriteElemInitializers();
  WriteFuncs();
  WriteExports(CWriterPhase::Definitions);
  WriteInitInstanceImport();
  WriteImportProperties(CWriterPhase::Definitions);
  WriteInit();
  WriteFree();
  WriteGetFuncType();
}